

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O2

void lchange(int flag)

{
  buffer *pbVar1;
  mgwin *pmVar2;
  mgwin **ppmVar3;
  byte bVar4;
  byte bVar5;
  
  pbVar1 = curbp;
  bVar5 = (byte)flag;
  if ((curbp->b_flag & 1U) == 0) {
    bVar5 = bVar5 | 0x10;
    curbp->b_flag = curbp->b_flag | 1;
  }
  pmVar2 = curwp;
  ppmVar3 = &wheadp;
  while (ppmVar3 = (mgwin **)(((mgwin *)ppmVar3)->w_list).l_p.l_wp, (mgwin *)ppmVar3 != (mgwin *)0x0
        ) {
    if (((mgwin *)ppmVar3)->w_bufp == pbVar1) {
      bVar4 = ((mgwin *)ppmVar3)->w_rflag | bVar5;
      ((mgwin *)ppmVar3)->w_rflag = bVar4;
      if ((mgwin *)ppmVar3 != pmVar2) {
        ((mgwin *)ppmVar3)->w_rflag = bVar4 | 8;
      }
    }
  }
  return;
}

Assistant:

void
lchange(int flag)
{
	struct mgwin	*wp;

	/* update mode lines if this is the first change. */
	if ((curbp->b_flag & BFCHG) == 0) {
		flag |= WFMODE;
		curbp->b_flag |= BFCHG;
	}
	for (wp = wheadp; wp != NULL; wp = wp->w_wndp) {
		if (wp->w_bufp == curbp) {
			wp->w_rflag |= flag;
			if (wp != curwp)
				wp->w_rflag |= WFFULL;
		}
	}
}